

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

void ztlex_destroy(ztlex_t *lex)

{
  int iVar1;
  uint uVar2;
  long *in_RDI;
  int remaining;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI == 0) {
      uVar2 = (int)in_RDI[0x23] - (int)in_RDI[0x24];
      if (uVar2 != 0) {
        fprintf(_stderr,"warning: lexer closed with %d bytes pending\n",(ulong)uVar2);
      }
    }
    else {
      iVar1 = feof((FILE *)*in_RDI);
      if (iVar1 == 0) {
        fprintf(_stderr,"warning: lexer closed with bytes pending\n");
      }
      fclose((FILE *)*in_RDI);
    }
    (*(code *)in_RDI[0x49])(in_RDI);
  }
  return;
}

Assistant:

void ztlex_destroy(ztlex_t *lex)
{
  if (lex == NULL)
    return;

  if (lex->file)
  {
    if (!feof(lex->file))
      fprintf(stderr, "warning: lexer closed with bytes pending\n");

    fclose(lex->file);
  }
  else
  {
    int remaining = (int)(lex->length - lex->index);
    if (remaining)
      fprintf(stderr, "warning: lexer closed with %d bytes pending\n",
              remaining);
  }

  lex->freefn(lex);
}